

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mxu_S32AND(DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t XRa;
  uint32_t XRb;
  uint32_t XRc;
  uint32_t pad;
  TCGContext_conflict4 *tcg_ctx;
  DisasContext_conflict4 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x15,5);
  uVar2 = extract32(ctx->opcode,0xe,4);
  uVar3 = extract32(ctx->opcode,10,4);
  uVar4 = extract32(ctx->opcode,6,4);
  if ((uVar1 == 0) && (uVar4 != 0)) {
    if (uVar3 == 0 || uVar2 == 0) {
      tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],0);
    }
    else if (uVar3 == uVar2) {
      tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],tcg_ctx_00->mxu_gpr[uVar3 - 1]);
    }
    else {
      tcg_gen_and_i32(tcg_ctx_00,tcg_ctx_00->mxu_gpr[uVar4 - 1],tcg_ctx_00->mxu_gpr[uVar3 - 1],
                      tcg_ctx_00->mxu_gpr[uVar2 - 1]);
    }
  }
  return;
}

Assistant:

static void gen_mxu_S32AND(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t pad, XRc, XRb, XRa;

    pad = extract32(ctx->opcode, 21, 5);
    XRc = extract32(ctx->opcode, 14, 4);
    XRb = extract32(ctx->opcode, 10, 4);
    XRa = extract32(ctx->opcode,  6, 4);

    if (unlikely(pad != 0)) {
        /* opcode padding incorrect -> do nothing */
    } else if (unlikely(XRa == 0)) {
        /* destination is zero register -> do nothing */
    } else if (unlikely((XRb == 0) || (XRc == 0))) {
        /* one of operands zero register -> just set destination to all 0s */
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], 0);
    } else if (unlikely(XRb == XRc)) {
        /* both operands same -> just set destination to one of them */
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRb - 1]);
    } else {
        /* the most general case */
        tcg_gen_and_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRb - 1], tcg_ctx->mxu_gpr[XRc - 1]);
    }
}